

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeckBuilder.cpp
# Opt level: O0

list<GreenCard_*,_std::allocator<GreenCard_*>_> * __thiscall
DeckBuilder::createFateDeck_abi_cxx11_(DeckBuilder *this)

{
  list<GreenCard_*,_std::allocator<GreenCard_*>_> *plVar1;
  Footsoldier *this_00;
  Archer *this_01;
  Sieger *this_02;
  Cavalry *this_03;
  Atakebune *this_04;
  Bushido *this_05;
  Katana *this_06;
  Bow *this_07;
  Spear *this_08;
  Ninjato *this_09;
  Wakizashi *this_10;
  allocator local_231;
  string local_230 [32];
  Wakizashi *local_210;
  undefined1 local_202;
  allocator local_201;
  string local_200 [32];
  Ninjato *local_1e0;
  undefined1 local_1d2;
  allocator local_1d1;
  string local_1d0 [32];
  Spear *local_1b0;
  undefined1 local_1a2;
  allocator local_1a1;
  string local_1a0 [32];
  Bow *local_180;
  undefined1 local_172;
  allocator local_171;
  string local_170 [32];
  Katana *local_150;
  undefined1 local_142;
  allocator local_141;
  string local_140 [32];
  Bushido *local_120;
  undefined1 local_112;
  allocator local_111;
  string local_110 [32];
  Atakebune *local_f0;
  undefined1 local_e2;
  allocator local_e1;
  string local_e0 [32];
  Cavalry *local_c0;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [32];
  Sieger *local_90;
  undefined1 local_82;
  allocator local_81;
  string local_80 [32];
  Archer *local_60;
  undefined1 local_55;
  allocator local_41;
  string local_40 [32];
  Footsoldier *local_20;
  int local_14;
  DeckBuilder *pDStack_10;
  int i;
  DeckBuilder *this_local;
  
  pDStack_10 = this;
  for (local_14 = 0; local_14 < 6; local_14 = local_14 + 1) {
    plVar1 = this->green;
    this_00 = (Footsoldier *)operator_new(0x158);
    local_55 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"Peasants",&local_41);
    Footsoldier::Footsoldier(this_00,(string *)local_40,3,1);
    local_55 = 0;
    local_20 = this_00;
    std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::push_back
              (plVar1,(value_type *)&local_20);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  for (local_14 = 0; local_14 < 6; local_14 = local_14 + 1) {
    plVar1 = this->green;
    this_01 = (Archer *)operator_new(0x158);
    local_82 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"Elite Troops",&local_81);
    Archer::Archer(this_01,(string *)local_80,3,2);
    local_82 = 0;
    local_60 = this_01;
    std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::push_back
              (plVar1,(value_type *)&local_60);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
  }
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    plVar1 = this->green;
    this_02 = (Sieger *)operator_new(0x158);
    local_b2 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"Immortal Bushi",&local_b1);
    Sieger::Sieger(this_02,(string *)local_b0,3,3);
    local_b2 = 0;
    local_90 = this_02;
    std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::push_back
              (plVar1,(value_type *)&local_90);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  }
  for (local_14 = 0; local_14 < 5; local_14 = local_14 + 1) {
    plVar1 = this->green;
    this_03 = (Cavalry *)operator_new(0x158);
    local_e2 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,"Unicorn Horses",&local_e1);
    Cavalry::Cavalry(this_03,(string *)local_e0,3,4);
    local_e2 = 0;
    local_c0 = this_03;
    std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::push_back
              (plVar1,(value_type *)&local_c0);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  }
  for (local_14 = 0; local_14 < 5; local_14 = local_14 + 1) {
    plVar1 = this->green;
    this_04 = (Atakebune *)operator_new(0x158);
    local_112 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,"Yomi Ships",&local_111);
    Atakebune::Atakebune(this_04,(string *)local_110,3,5);
    local_112 = 0;
    local_f0 = this_04;
    std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::push_back
              (plVar1,(value_type *)&local_f0);
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
  }
  for (local_14 = 0; local_14 < 2; local_14 = local_14 + 1) {
    plVar1 = this->green;
    this_05 = (Bushido *)operator_new(0x158);
    local_142 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_140,"7 Samurai",&local_141);
    Bushido::Bushido(this_05,(string *)local_140,3,6);
    local_142 = 0;
    local_120 = this_05;
    std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::push_back
              (plVar1,(value_type *)&local_120);
    std::__cxx11::string::~string(local_140);
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
  }
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    plVar1 = this->green;
    this_06 = (Katana *)operator_new(0x168);
    local_172 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_170,"Daijtso",&local_171);
    Katana::Katana(this_06,(string *)local_170,4,1);
    local_172 = 0;
    local_150 = this_06;
    std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::push_back
              (plVar1,(value_type *)&local_150);
    std::__cxx11::string::~string(local_170);
    std::allocator<char>::~allocator((allocator<char> *)&local_171);
  }
  for (local_14 = 0; local_14 < 2; local_14 = local_14 + 1) {
    plVar1 = this->green;
    this_07 = (Bow *)operator_new(0x168);
    local_1a2 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a0,"Yumi",&local_1a1);
    Bow::Bow(this_07,(string *)local_1a0,4,3);
    local_1a2 = 0;
    local_180 = this_07;
    std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::push_back
              (plVar1,(value_type *)&local_180);
    std::__cxx11::string::~string(local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  }
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    plVar1 = this->green;
    this_08 = (Spear *)operator_new(0x168);
    local_1d2 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d0,"Kama",&local_1d1);
    Spear::Spear(this_08,(string *)local_1d0,4,2);
    local_1d2 = 0;
    local_1b0 = this_08;
    std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::push_back
              (plVar1,(value_type *)&local_1b0);
    std::__cxx11::string::~string(local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  }
  for (local_14 = 0; local_14 < 2; local_14 = local_14 + 1) {
    plVar1 = this->green;
    this_09 = (Ninjato *)operator_new(0x168);
    local_202 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_200,"Butterfly Dagger",&local_201);
    Ninjato::Ninjato(this_09,(string *)local_200,4,4);
    local_202 = 0;
    local_1e0 = this_09;
    std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::push_back
              (plVar1,(value_type *)&local_1e0);
    std::__cxx11::string::~string(local_200);
    std::allocator<char>::~allocator((allocator<char> *)&local_201);
  }
  for (local_14 = 0; local_14 < 1; local_14 = local_14 + 1) {
    plVar1 = this->green;
    this_10 = (Wakizashi *)operator_new(0x168);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_230,"Kusanagi",&local_231);
    Wakizashi::Wakizashi(this_10,(string *)local_230,4,5);
    local_210 = this_10;
    std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::push_back
              (plVar1,(value_type *)&local_210);
    std::__cxx11::string::~string(local_230);
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
  }
  return this->green;
}

Assistant:

list<GreenCard *> *DeckBuilder::createFateDeck()
{
    //enum Type{PERSONALITY = 1, HOLDING, FOLLOWER, ITEM};
    //added 2 ints in constructors
    //first int corresponds to Card::Type enum
    //second to Card::Followers, Items, Personalities or Holdings

	int i;
	for (i = 0; i < NO_FOOTSOLDIER; i++)
		green->push_back(new Footsoldier{"Peasants", 3, 1});
	for (i = 0; i < NO_ARCHER; i++)
		green->push_back(new Archer{"Elite Troops", 3, 2});
	for (i = 0; i < NO_SIEGER; i++)
		green->push_back(new Sieger{"Immortal Bushi", 3, 3});
	for (i = 0; i < NO_CAVALRY; i++)
		green->push_back(new Cavalry{"Unicorn Horses", 3, 4});
	for (i = 0; i < NO_NAVAL; i++)
		green->push_back(new Atakebune{"Yomi Ships", 3, 5});
	for (i = 0; i < NO_BUSHIDO; i++)
		green->push_back(new Bushido{"7 Samurai", 3, 6});

	for (i = 0; i < NO_KATANA; i++)
		green->push_back(new Katana{"Daijtso", 4, 1});
	for (i = 0; i < NO_BOW; i++)
		green->push_back(new Bow{"Yumi", 4, 3});
	for (i = 0; i < NO_SPEAR; i++)
		green->push_back(new Spear{"Kama", 4, 2});
	for (i = 0; i < NO_NINJATO; i++)
		green->push_back(new Ninjato{"Butterfly Dagger", 4, 4});
	for (i = 0; i < NO_WAKIZASHI; i++)
		green->push_back(new Wakizashi{"Kusanagi", 4, 5});

	return green;
}